

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdatePlatformWindows(void)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  float fVar3;
  char cVar4;
  char *text;
  ImGuiViewportP *pIVar5;
  bool bVar6;
  ImGuiContext *pIVar7;
  ImGuiViewportP *pIVar8;
  bool bVar9;
  ImGuiID IVar10;
  ImGuiViewportP **ppIVar11;
  ImGuiWindow *pIVar12;
  char *pcVar13;
  int iVar14;
  byte local_82;
  ImGuiViewportP *viewport_1;
  ImGuiViewportP *pIStack_70;
  int n;
  ImGuiViewportP *focused_viewport;
  char title_end_backup_c;
  ImGuiID title_hash;
  char *title_end;
  char *title_begin;
  ImGuiWindow *window_for_title;
  ImVec2 local_2c;
  byte local_22;
  byte local_21;
  bool is_new_platform_window;
  ImGuiViewportP *pIStack_20;
  bool destroy_platform_window;
  ImGuiViewportP *viewport;
  ImGuiContext *pIStack_10;
  int i;
  ImGuiContext *g;
  
  pIVar7 = GImGui;
  pIStack_10 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    __assert_fail("g.FrameCountEnded == g.FrameCount && \"Forgot to call Render() or EndFrame() before UpdatePlatformWindows()?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3042,"void ImGui::UpdatePlatformWindows()");
  }
  if (GImGui->FrameCount <= GImGui->FrameCountPlatformEnded) {
    __assert_fail("g.FrameCountPlatformEnded < g.FrameCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3043,"void ImGui::UpdatePlatformWindows()");
  }
  GImGui->FrameCountPlatformEnded = GImGui->FrameCount;
  if ((pIVar7->ConfigFlagsCurrFrame & 0x400U) != 0) {
    for (viewport._4_4_ = 1; viewport._4_4_ < (pIStack_10->Viewports).Size;
        viewport._4_4_ = viewport._4_4_ + 1) {
      ppIVar11 = ImVector<ImGuiViewportP_*>::operator[](&pIStack_10->Viewports,viewport._4_4_);
      pIStack_20 = *ppIVar11;
      local_21 = pIStack_20->LastFrameActive < pIStack_10->FrameCount + -1;
      local_82 = 0;
      if (pIStack_20->Window != (ImGuiWindow *)0x0) {
        bVar9 = IsWindowActiveAndVisible(pIStack_20->Window);
        local_82 = bVar9 ^ 0xff;
      }
      bVar9 = (local_21 & 1) != 0;
      bVar6 = (local_82 & 1) != 0;
      local_21 = bVar9 || bVar6;
      if (bVar9 || bVar6) {
        DestroyPlatformWindow(pIStack_20);
      }
      else if (((pIStack_10->FrameCount <= pIStack_20->LastFrameActive) &&
               (0.0 < (pIStack_20->super_ImGuiViewport).Size.x)) &&
              (0.0 < (pIStack_20->super_ImGuiViewport).Size.y)) {
        local_22 = (pIStack_20->PlatformWindowCreated & 1U) == 0;
        if ((bool)local_22) {
          (*(pIStack_10->PlatformIO).Platform_CreateWindow)(&pIStack_20->super_ImGuiViewport);
          if ((pIStack_10->PlatformIO).Renderer_CreateWindow != (_func_void_ImGuiViewport_ptr *)0x0)
          {
            (*(pIStack_10->PlatformIO).Renderer_CreateWindow)(&pIStack_20->super_ImGuiViewport);
          }
          pIStack_20->LastNameHash = 0;
          ImVec2::ImVec2(&local_2c,3.4028235e+38,3.4028235e+38);
          pIStack_20->LastPlatformSize = local_2c;
          pIStack_20->LastPlatformPos = pIStack_20->LastPlatformSize;
          pIStack_20->LastRendererSize = (pIStack_20->super_ImGuiViewport).Size;
          pIStack_20->PlatformWindowCreated = true;
        }
        fVar3 = (pIStack_20->LastPlatformPos).x;
        pIVar1 = &(pIStack_20->super_ImGuiViewport).Pos;
        if ((((fVar3 != pIVar1->x) || (NAN(fVar3) || NAN(pIVar1->x))) ||
            ((fVar3 = (pIStack_20->LastPlatformPos).y,
             pfVar2 = &(pIStack_20->super_ImGuiViewport).Pos.y, fVar3 != *pfVar2 ||
             (NAN(fVar3) || NAN(*pfVar2))))) &&
           (((pIStack_20->super_ImGuiViewport).PlatformRequestMove & 1U) == 0)) {
          (*(pIStack_10->PlatformIO).Platform_SetWindowPos)
                    (&pIStack_20->super_ImGuiViewport,(pIStack_20->super_ImGuiViewport).Pos);
        }
        fVar3 = (pIStack_20->LastPlatformSize).x;
        pIVar1 = &(pIStack_20->super_ImGuiViewport).Size;
        if ((((fVar3 != pIVar1->x) || (NAN(fVar3) || NAN(pIVar1->x))) ||
            ((fVar3 = (pIStack_20->LastPlatformSize).y,
             pfVar2 = &(pIStack_20->super_ImGuiViewport).Size.y, fVar3 != *pfVar2 ||
             (NAN(fVar3) || NAN(*pfVar2))))) &&
           (((pIStack_20->super_ImGuiViewport).PlatformRequestResize & 1U) == 0)) {
          (*(pIStack_10->PlatformIO).Platform_SetWindowSize)
                    (&pIStack_20->super_ImGuiViewport,(pIStack_20->super_ImGuiViewport).Size);
        }
        fVar3 = (pIStack_20->LastRendererSize).x;
        pIVar1 = &(pIStack_20->super_ImGuiViewport).Size;
        if (((((fVar3 != pIVar1->x) || (NAN(fVar3) || NAN(pIVar1->x))) ||
             (fVar3 = (pIStack_20->LastRendererSize).y,
             pfVar2 = &(pIStack_20->super_ImGuiViewport).Size.y, fVar3 != *pfVar2)) ||
            (NAN(fVar3) || NAN(*pfVar2))) &&
           ((pIStack_10->PlatformIO).Renderer_SetWindowSize !=
            (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0)) {
          (*(pIStack_10->PlatformIO).Renderer_SetWindowSize)
                    (&pIStack_20->super_ImGuiViewport,(pIStack_20->super_ImGuiViewport).Size);
        }
        pIStack_20->LastPlatformPos = (pIStack_20->super_ImGuiViewport).Pos;
        pIStack_20->LastRendererSize = (pIStack_20->super_ImGuiViewport).Size;
        pIStack_20->LastPlatformSize = pIStack_20->LastRendererSize;
        pIVar12 = GetWindowForTitleDisplay(pIStack_20->Window);
        if (pIVar12 != (ImGuiWindow *)0x0) {
          text = pIVar12->Name;
          pcVar13 = FindRenderedTextEnd(text,(char *)0x0);
          IVar10 = ImHashStr(text,(long)pcVar13 - (long)text,0);
          if (pIStack_20->LastNameHash != IVar10) {
            cVar4 = *pcVar13;
            *pcVar13 = '\0';
            (*(pIStack_10->PlatformIO).Platform_SetWindowTitle)
                      (&pIStack_20->super_ImGuiViewport,text);
            *pcVar13 = cVar4;
            pIStack_20->LastNameHash = IVar10;
          }
        }
        if (((pIStack_20->LastAlpha != pIStack_20->Alpha) ||
            (NAN(pIStack_20->LastAlpha) || NAN(pIStack_20->Alpha))) &&
           ((pIStack_10->PlatformIO).Platform_SetWindowAlpha !=
            (_func_void_ImGuiViewport_ptr_float *)0x0)) {
          (*(pIStack_10->PlatformIO).Platform_SetWindowAlpha)
                    (&pIStack_20->super_ImGuiViewport,pIStack_20->Alpha);
        }
        pIStack_20->LastAlpha = pIStack_20->Alpha;
        if ((pIStack_10->PlatformIO).Platform_UpdateWindow != (_func_void_ImGuiViewport_ptr *)0x0) {
          (*(pIStack_10->PlatformIO).Platform_UpdateWindow)(&pIStack_20->super_ImGuiViewport);
        }
        if ((local_22 & 1) != 0) {
          if (pIStack_10->FrameCount < 3) {
            (pIStack_20->super_ImGuiViewport).Flags = (pIStack_20->super_ImGuiViewport).Flags | 0x20
            ;
          }
          (*(pIStack_10->PlatformIO).Platform_ShowWindow)(&pIStack_20->super_ImGuiViewport);
          if (pIStack_20->LastFrontMostStampCount != pIStack_10->ViewportFrontMostStampCount) {
            iVar14 = pIStack_10->ViewportFrontMostStampCount + 1;
            pIStack_10->ViewportFrontMostStampCount = iVar14;
            pIStack_20->LastFrontMostStampCount = iVar14;
          }
        }
        ImGuiViewportP::ClearRequestFlags(pIStack_20);
      }
    }
    if ((pIStack_10->PlatformIO).Platform_GetWindowFocus != (_func_bool_ImGuiViewport_ptr *)0x0) {
      pIStack_70 = (ImGuiViewportP *)0x0;
      for (viewport_1._4_4_ = 0;
          viewport_1._4_4_ < (pIStack_10->Viewports).Size && pIStack_70 == (ImGuiViewportP *)0x0;
          viewport_1._4_4_ = viewport_1._4_4_ + 1) {
        ppIVar11 = ImVector<ImGuiViewportP_*>::operator[](&pIStack_10->Viewports,viewport_1._4_4_);
        pIVar5 = *ppIVar11;
        pIVar8 = pIStack_70;
        if (((pIVar5->PlatformWindowCreated & 1U) != 0) &&
           (bVar9 = (*(pIStack_10->PlatformIO).Platform_GetWindowFocus)
                              (&pIVar5->super_ImGuiViewport), pIVar8 = pIVar5, !bVar9)) {
          pIVar8 = pIStack_70;
        }
        pIStack_70 = pIVar8;
      }
      if ((pIStack_70 != (ImGuiViewportP *)0x0) &&
         (pIStack_10->PlatformLastFocusedViewportId != (pIStack_70->super_ImGuiViewport).ID)) {
        if (pIStack_70->LastFrontMostStampCount != pIStack_10->ViewportFrontMostStampCount) {
          iVar14 = pIStack_10->ViewportFrontMostStampCount + 1;
          pIStack_10->ViewportFrontMostStampCount = iVar14;
          pIStack_70->LastFrontMostStampCount = iVar14;
        }
        pIStack_10->PlatformLastFocusedViewportId = (pIStack_70->super_ImGuiViewport).ID;
      }
    }
  }
  return;
}

Assistant:

void ImGui::UpdatePlatformWindows()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.FrameCountEnded == g.FrameCount && "Forgot to call Render() or EndFrame() before UpdatePlatformWindows()?");
    IM_ASSERT(g.FrameCountPlatformEnded < g.FrameCount);
    g.FrameCountPlatformEnded = g.FrameCount;
    if (!(g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable))
        return;

    // Create/resize/destroy platform windows to match each active viewport.
    // Skip the main viewport (index 0), which is always fully handled by the application!
    for (int i = 1; i < g.Viewports.Size; i++)
    {
        ImGuiViewportP* viewport = g.Viewports[i];

        // Destroy platform window if the viewport hasn't been submitted or if it is hosting a hidden window
        // (the implicit/fallback Debug##Default window will be registering its viewport then be disabled, causing a dummy DestroyPlatformWindow to be made each frame)
        bool destroy_platform_window = false;
        destroy_platform_window |= (viewport->LastFrameActive < g.FrameCount - 1);
        destroy_platform_window |= (viewport->Window && !IsWindowActiveAndVisible(viewport->Window));
        if (destroy_platform_window)
        {
            DestroyPlatformWindow(viewport);
            continue;
        }

        // New windows that appears directly in a new viewport won't always have a size on their first frame
        if (viewport->LastFrameActive < g.FrameCount || viewport->Size.x <= 0 || viewport->Size.y <= 0)
            continue;

        // Create window
        bool is_new_platform_window = (viewport->PlatformWindowCreated == false);
        if (is_new_platform_window)
        {
            IMGUI_DEBUG_LOG_VIEWPORT("Create Platform Window %08X (%s)\n", viewport->ID, viewport->Window ? viewport->Window->Name : "n/a");
            g.PlatformIO.Platform_CreateWindow(viewport);
            if (g.PlatformIO.Renderer_CreateWindow != NULL)
                g.PlatformIO.Renderer_CreateWindow(viewport);
            viewport->LastNameHash = 0;
            viewport->LastPlatformPos = viewport->LastPlatformSize = ImVec2(FLT_MAX, FLT_MAX); // By clearing those we'll enforce a call to Platform_SetWindowPos/Size below, before Platform_ShowWindow (FIXME: Is that necessary?)
            viewport->LastRendererSize = viewport->Size;                                       // We don't need to call Renderer_SetWindowSize() as it is expected Renderer_CreateWindow() already did it.
            viewport->PlatformWindowCreated = true;
        }

        // Apply Position and Size (from ImGui to Platform/Renderer backends)
        if ((viewport->LastPlatformPos.x != viewport->Pos.x || viewport->LastPlatformPos.y != viewport->Pos.y) && !viewport->PlatformRequestMove)
            g.PlatformIO.Platform_SetWindowPos(viewport, viewport->Pos);
        if ((viewport->LastPlatformSize.x != viewport->Size.x || viewport->LastPlatformSize.y != viewport->Size.y) && !viewport->PlatformRequestResize)
            g.PlatformIO.Platform_SetWindowSize(viewport, viewport->Size);
        if ((viewport->LastRendererSize.x != viewport->Size.x || viewport->LastRendererSize.y != viewport->Size.y) && g.PlatformIO.Renderer_SetWindowSize)
            g.PlatformIO.Renderer_SetWindowSize(viewport, viewport->Size);
        viewport->LastPlatformPos = viewport->Pos;
        viewport->LastPlatformSize = viewport->LastRendererSize = viewport->Size;

        // Update title bar (if it changed)
        if (ImGuiWindow* window_for_title = GetWindowForTitleDisplay(viewport->Window))
        {
            const char* title_begin = window_for_title->Name;
            char* title_end = (char*)(intptr_t)FindRenderedTextEnd(title_begin);
            const ImGuiID title_hash = ImHashStr(title_begin, title_end - title_begin);
            if (viewport->LastNameHash != title_hash)
            {
                char title_end_backup_c = *title_end;
                *title_end = 0; // Cut existing buffer short instead of doing an alloc/free, no small gain.
                g.PlatformIO.Platform_SetWindowTitle(viewport, title_begin);
                *title_end = title_end_backup_c;
                viewport->LastNameHash = title_hash;
            }
        }

        // Update alpha (if it changed)
        if (viewport->LastAlpha != viewport->Alpha && g.PlatformIO.Platform_SetWindowAlpha)
            g.PlatformIO.Platform_SetWindowAlpha(viewport, viewport->Alpha);
        viewport->LastAlpha = viewport->Alpha;

        // Optional, general purpose call to allow the backend to perform general book-keeping even if things haven't changed.
        if (g.PlatformIO.Platform_UpdateWindow)
            g.PlatformIO.Platform_UpdateWindow(viewport);

        if (is_new_platform_window)
        {
            // On startup ensure new platform window don't steal focus (give it a few frames, as nested contents may lead to viewport being created a few frames late)
            if (g.FrameCount < 3)
                viewport->Flags |= ImGuiViewportFlags_NoFocusOnAppearing;

            // Show window
            g.PlatformIO.Platform_ShowWindow(viewport);

            // Even without focus, we assume the window becomes front-most.
            // This is useful for our platform z-order heuristic when io.MouseHoveredViewport is not available.
            if (viewport->LastFrontMostStampCount != g.ViewportFrontMostStampCount)
                viewport->LastFrontMostStampCount = ++g.ViewportFrontMostStampCount;
            }

        // Clear request flags
        viewport->ClearRequestFlags();
    }

    // Update our implicit z-order knowledge of platform windows, which is used when the backend cannot provide io.MouseHoveredViewport.
    // When setting Platform_GetWindowFocus, it is expected that the platform backend can handle calls without crashing if it doesn't have data stored.
    // FIXME-VIEWPORT: We should use this information to also set dear imgui-side focus, allowing us to handle os-level alt+tab.
    if (g.PlatformIO.Platform_GetWindowFocus != NULL)
    {
        ImGuiViewportP* focused_viewport = NULL;
        for (int n = 0; n < g.Viewports.Size && focused_viewport == NULL; n++)
        {
            ImGuiViewportP* viewport = g.Viewports[n];
            if (viewport->PlatformWindowCreated)
                if (g.PlatformIO.Platform_GetWindowFocus(viewport))
                    focused_viewport = viewport;
        }

        // Store a tag so we can infer z-order easily from all our windows
        // We compare PlatformLastFocusedViewportId so newly created viewports with _NoFocusOnAppearing flag
        // will keep the front most stamp instead of losing it back to their parent viewport.
        if (focused_viewport && g.PlatformLastFocusedViewportId != focused_viewport->ID)
        {
            if (focused_viewport->LastFrontMostStampCount != g.ViewportFrontMostStampCount)
                focused_viewport->LastFrontMostStampCount = ++g.ViewportFrontMostStampCount;
            g.PlatformLastFocusedViewportId = focused_viewport->ID;
        }
    }
}